

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::ParseCtorDtorName(State *state)

{
  int iVar1;
  char *pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  char *prev_name_1;
  char *prev_name;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar6 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar6) {
    state_local._7_1_ = false;
    goto LAB_0010a284;
  }
  uVar3 = ((guard.state_)->parse_state).mangled_idx;
  uVar4 = ((guard.state_)->parse_state).out_cur_idx;
  uVar5 = *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx;
  bVar6 = ParseOneCharToken(guard.state_,'C');
  if (bVar6) {
    bVar6 = ParseCharClass(guard.state_,"1234");
    if (bVar6) {
      MaybeAppendWithLength
                (guard.state_,(guard.state_)->out + ((guard.state_)->parse_state).prev_name_idx,
                 (ulong)*(ushort *)&((guard.state_)->parse_state).field_0xc);
      state_local._7_1_ = true;
      goto LAB_0010a284;
    }
    bVar6 = ParseOneCharToken(guard.state_,'I');
    if (((bVar6) && (bVar6 = ParseCharClass(guard.state_,"12"), bVar6)) &&
       (bVar6 = ParseClassEnumType(guard.state_), bVar6)) {
      state_local._7_1_ = true;
      goto LAB_0010a284;
    }
  }
  ((guard.state_)->parse_state).mangled_idx = uVar3;
  ((guard.state_)->parse_state).out_cur_idx = uVar4;
  *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar5;
  bVar6 = ParseOneCharToken(guard.state_,'D');
  if ((bVar6) && (bVar6 = ParseCharClass(guard.state_,"0124"), bVar6)) {
    pcVar2 = (guard.state_)->out;
    iVar1 = ((guard.state_)->parse_state).prev_name_idx;
    MaybeAppend(guard.state_,"~");
    MaybeAppendWithLength
              (guard.state_,pcVar2 + iVar1,
               (ulong)*(ushort *)&((guard.state_)->parse_state).field_0xc);
    state_local._7_1_ = true;
  }
  else {
    ((guard.state_)->parse_state).mangled_idx = uVar3;
    ((guard.state_)->parse_state).out_cur_idx = uVar4;
    *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar5;
    state_local._7_1_ = false;
  }
LAB_0010a284:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseCtorDtorName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'C')) {
    if (ParseCharClass(state, "1234")) {
      const char *const prev_name =
          state->out + state->parse_state.prev_name_idx;
      MaybeAppendWithLength(state, prev_name,
                            state->parse_state.prev_name_length);
      return true;
    } else if (ParseOneCharToken(state, 'I') && ParseCharClass(state, "12") &&
               ParseClassEnumType(state)) {
      return true;
    }
  }
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'D') && ParseCharClass(state, "0124")) {
    const char *const prev_name = state->out + state->parse_state.prev_name_idx;
    MaybeAppend(state, "~");
    MaybeAppendWithLength(state, prev_name,
                          state->parse_state.prev_name_length);
    return true;
  }
  state->parse_state = copy;
  return false;
}